

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqualityProxyMono.cpp
# Opt level: O3

void __thiscall
Shell::EqualityProxyMono::addLocalAxioms(EqualityProxyMono *this,UnitList **units,TermList sort)

{
  UnitList *pUVar1;
  uint uVar2;
  EqualityProxy EVar3;
  Literal *pLVar4;
  Clause *pCVar5;
  UnitList *pUVar6;
  ulong uVar7;
  EqualityProxyMono *pEVar8;
  Stack<Kernel::Literal_*> *pSVar9;
  EqualityProxyMono *pEVar10;
  Stack<Kernel::Literal_*> *pSVar11;
  Stack<Kernel::Literal_*> *pSVar12;
  Stack<Kernel::Literal_*> *pSVar13;
  Stack<Kernel::Literal_*> *pSVar14;
  Stack<Kernel::Literal_*> *pSVar15;
  Stack<Kernel::Literal_*> local_68;
  TermList local_48;
  undefined8 local_40;
  
  pSVar9 = &local_68;
  pSVar11 = &local_68;
  pSVar12 = &local_68;
  pSVar13 = &local_68;
  pSVar14 = &local_68;
  pSVar15 = &local_68;
  local_68._cursor = (Literal **)0x0;
  local_68._end = (Literal **)0x0;
  local_68._capacity = 0;
  local_68._stack = (Literal **)0x0;
  uVar2 = getProxyPredicate(this,sort);
  local_48._content = 1;
  local_40 = 1;
  pEVar8 = (EqualityProxyMono *)(ulong)uVar2;
  pLVar4 = Kernel::Literal::create(uVar2,2,true,&local_48);
  if (local_68._cursor == local_68._end) {
    Lib::Stack<Kernel::Literal_*>::expand(&local_68);
    pEVar8 = (EqualityProxyMono *)pSVar9;
  }
  *local_68._cursor = pLVar4;
  local_68._cursor = local_68._cursor + 1;
  pCVar5 = createEqProxyAxiom(pEVar8,&local_68);
  pUVar1 = *units;
  pEVar8 = (EqualityProxyMono *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18);
  pEVar10 = pEVar8;
  pUVar6 = (UnitList *)
           Lib::FixedSizeAllocator<16UL>::alloc
                     ((FixedSizeAllocator<16UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
  pUVar6->_head = &pCVar5->super_Unit;
  pUVar6->_tail = pUVar1;
  *units = pUVar6;
  EVar3 = this->_opt;
  if (EVar3 - RS < 3) {
    local_68._cursor = local_68._stack;
    uVar2 = getProxyPredicate(pEVar10,sort);
    local_48._content = 1;
    local_40 = 5;
    pEVar10 = (EqualityProxyMono *)(ulong)uVar2;
    pLVar4 = Kernel::Literal::create(uVar2,2,false,&local_48);
    if (local_68._cursor == local_68._end) {
      Lib::Stack<Kernel::Literal_*>::expand(&local_68);
      pEVar10 = (EqualityProxyMono *)pSVar11;
    }
    *local_68._cursor = pLVar4;
    local_68._cursor = local_68._cursor + 1;
    uVar2 = getProxyPredicate(pEVar10,sort);
    local_48._content = 5;
    local_40 = 1;
    pEVar10 = (EqualityProxyMono *)(ulong)uVar2;
    pLVar4 = Kernel::Literal::create(uVar2,2,true,&local_48);
    if (local_68._cursor == local_68._end) {
      Lib::Stack<Kernel::Literal_*>::expand(&local_68);
      pEVar10 = (EqualityProxyMono *)pSVar12;
    }
    *local_68._cursor = pLVar4;
    local_68._cursor = local_68._cursor + 1;
    pCVar5 = createEqProxyAxiom(pEVar10,&local_68);
    pUVar1 = *units;
    pUVar6 = (UnitList *)
             Lib::FixedSizeAllocator<16UL>::alloc
                       ((FixedSizeAllocator<16UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
    pUVar6->_head = &pCVar5->super_Unit;
    pUVar6->_tail = pUVar1;
    *units = pUVar6;
    EVar3 = this->_opt;
    pEVar10 = pEVar8;
  }
  if ((EVar3 & ~RS) == RST) {
    local_68._cursor = local_68._stack;
    uVar2 = getProxyPredicate(pEVar10,sort);
    local_48._content = 1;
    local_40 = 5;
    pEVar8 = (EqualityProxyMono *)(ulong)uVar2;
    pLVar4 = Kernel::Literal::create(uVar2,2,false,&local_48);
    if (local_68._cursor == local_68._end) {
      Lib::Stack<Kernel::Literal_*>::expand(&local_68);
      pEVar8 = (EqualityProxyMono *)pSVar13;
    }
    *local_68._cursor = pLVar4;
    local_68._cursor = local_68._cursor + 1;
    uVar2 = getProxyPredicate(pEVar8,sort);
    local_48._content = 5;
    local_40 = 9;
    pEVar8 = (EqualityProxyMono *)(ulong)uVar2;
    pLVar4 = Kernel::Literal::create(uVar2,2,false,&local_48);
    if (local_68._cursor == local_68._end) {
      Lib::Stack<Kernel::Literal_*>::expand(&local_68);
      pEVar8 = (EqualityProxyMono *)pSVar14;
    }
    *local_68._cursor = pLVar4;
    local_68._cursor = local_68._cursor + 1;
    uVar2 = getProxyPredicate(pEVar8,sort);
    local_48._content = 1;
    local_40 = 9;
    pEVar8 = (EqualityProxyMono *)(ulong)uVar2;
    pLVar4 = Kernel::Literal::create(uVar2,2,true,&local_48);
    if (local_68._cursor == local_68._end) {
      Lib::Stack<Kernel::Literal_*>::expand(&local_68);
      pEVar8 = (EqualityProxyMono *)pSVar15;
    }
    *local_68._cursor = pLVar4;
    local_68._cursor = local_68._cursor + 1;
    pCVar5 = createEqProxyAxiom(pEVar8,&local_68);
    pUVar1 = *units;
    pUVar6 = (UnitList *)
             Lib::FixedSizeAllocator<16UL>::alloc
                       ((FixedSizeAllocator<16UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
    pUVar6->_head = &pCVar5->super_Unit;
    pUVar6->_tail = pUVar1;
    *units = pUVar6;
  }
  if (local_68._stack != (Literal **)0x0) {
    uVar7 = local_68._capacity * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar7 == 0) {
      *local_68._stack = (Literal *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_68._stack;
    }
    else if (uVar7 < 0x11) {
      *local_68._stack = (Literal *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_68._stack;
    }
    else if (uVar7 < 0x19) {
      *local_68._stack = (Literal *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_68._stack;
    }
    else if (uVar7 < 0x21) {
      *local_68._stack = (Literal *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_68._stack;
    }
    else if (uVar7 < 0x31) {
      *local_68._stack = (Literal *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_68._stack;
    }
    else if (uVar7 < 0x41) {
      *local_68._stack = (Literal *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_68._stack;
    }
    else {
      operator_delete(local_68._stack,0x10);
    }
  }
  return;
}

Assistant:

void EqualityProxyMono::addLocalAxioms(UnitList*& units, TermList sort)
{
  // reflexivity
  Stack<Literal*> lits;
  lits.push(makeProxyLiteral(true,TermList(0,false),TermList(0,false), sort));
  UnitList::push(createEqProxyAxiom(lits),units);

  // symmetry
  if (_opt == Options::EqualityProxy::RS || _opt == Options::EqualityProxy::RST || _opt == Options::EqualityProxy::RSTC) {
    lits.reset();
    lits.push(makeProxyLiteral(false,TermList(0,false),TermList(1,false), sort));
    lits.push(makeProxyLiteral(true,TermList(1,false),TermList(0,false), sort));
    UnitList::push(createEqProxyAxiom(lits),units);
  }
  // transitivity
  if (_opt == Options::EqualityProxy::RST || _opt == Options::EqualityProxy::RSTC) {
    lits.reset();
    lits.push(makeProxyLiteral(false,TermList(0,false),TermList(1,false), sort));
    lits.push(makeProxyLiteral(false,TermList(1,false),TermList(2,false), sort));
    lits.push(makeProxyLiteral(true,TermList(0,false),TermList(2,false), sort));
    UnitList::push(createEqProxyAxiom(lits),units);
  }
}